

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_charcode.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
iutest::detail::CodeConvert<char32_t,char,__mbstate_t>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,char32_t *str)

{
  detail *pdVar1;
  detail *__last;
  wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  conv;
  wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  local_70;
  
  local_70._M_cvt._M_t.
  super___uniq_ptr_impl<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_iutest::detail::codecvt<char32_t,_char,___mbstate_t>_*,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>_>
  .super__Head_base<0UL,_iutest::detail::codecvt<char32_t,_char,___mbstate_t>_*,_false>._M_head_impl
       = (__uniq_ptr_data<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>,_true,_true>
          )operator_new(0x10);
  *(undefined8 *)
   local_70._M_cvt._M_t.
   super___uniq_ptr_impl<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_iutest::detail::codecvt<char32_t,_char,___mbstate_t>_*,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>_>
   .super__Head_base<0UL,_iutest::detail::codecvt<char32_t,_char,___mbstate_t>_*,_false>.
   _M_head_impl = 0;
  *(undefined8 *)
   ((long)local_70._M_cvt._M_t.
          super___uniq_ptr_impl<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_iutest::detail::codecvt<char32_t,_char,___mbstate_t>_*,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>_>
          .super__Head_base<0UL,_iutest::detail::codecvt<char32_t,_char,___mbstate_t>_*,_false>.
          _M_head_impl + 8) = 0;
  *(undefined ***)
   local_70._M_cvt._M_t.
   super___uniq_ptr_impl<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_iutest::detail::codecvt<char32_t,_char,___mbstate_t>_*,_std::default_delete<iutest::detail::codecvt<char32_t,_char,___mbstate_t>_>_>
   .super__Head_base<0UL,_iutest::detail::codecvt<char32_t,_char,___mbstate_t>_*,_false>.
   _M_head_impl = &PTR__codecvt_0015fa88;
  local_70._M_byte_err_string._M_dataplus._M_p = (pointer)&local_70._M_byte_err_string.field_2;
  local_70._M_byte_err_string._M_string_length = 0;
  local_70._M_byte_err_string.field_2._M_local_buf[0] = '\0';
  local_70._M_wide_err_string._M_dataplus._M_p = (pointer)&local_70._M_wide_err_string.field_2;
  local_70._M_wide_err_string._M_string_length = 0;
  local_70._M_wide_err_string.field_2._M_local_buf[0] = L'\0';
  local_70._M_state.__count = 0;
  local_70._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_70._M_count = 0;
  local_70._M_with_cvtstate = false;
  local_70._M_with_strings = false;
  __last = this + -4;
  do {
    pdVar1 = __last + 4;
    __last = __last + 4;
  } while (*(char32_t *)pdVar1 != L'\0');
  std::__cxx11::
  wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,&local_70,(char32_t *)this,(char32_t *)__last);
  std::__cxx11::
  wstring_convert<iutest::detail::codecvt<char32_t,_char,___mbstate_t>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_70);
  return __return_storage_ptr__;
}

Assistant:

::std::basic_string<Out> CodeConvert(const In* str)
{
    ::std::wstring_convert< codecvt<In, Out, State>, In> conv;
    //::std::wstring_convert< codecvt<In, Out, State>, In> conv(&::std::use_facet< ::std::codecvt<In, Out, State> >(loc) );
    return conv.to_bytes(str);
}